

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger array_replace(HSQUIRRELVM v)

{
  SQObjectPtr *pSVar1;
  EVP_PKEY_CTX *src_00;
  SQVM *in_RDI;
  SQArray *src;
  SQArray *dst;
  SQChar *in_stack_ffffffffffffffd8;
  HSQUIRRELVM in_stack_ffffffffffffffe0;
  SQArray *this;
  SQTable *n;
  SQRESULT local_8;
  
  pSVar1 = stack_get(in_stack_ffffffffffffffe0,(SQInteger)in_stack_ffffffffffffffd8);
  if (((pSVar1->super_SQObject)._flags & 1) == 0) {
    pSVar1 = stack_get(in_stack_ffffffffffffffe0,(SQInteger)in_stack_ffffffffffffffd8);
    n = (pSVar1->super_SQObject)._unVal.pTable;
    pSVar1 = stack_get(in_stack_ffffffffffffffe0,(SQInteger)in_stack_ffffffffffffffd8);
    this = (pSVar1->super_SQObject)._unVal.pArray;
    sqvector<SQObjectPtr,_unsigned_int>::copy
              ((sqvector<SQObjectPtr,_unsigned_int> *)&(n->super_SQDelegable)._delegate,
               (EVP_PKEY_CTX *)&this->_values,src_00);
    SQArray::ShrinkIfNeeded(this);
    SQVM::Pop(in_RDI,(SQInteger)n);
    local_8 = 1;
  }
  else {
    local_8 = sq_throwerror(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  return local_8;
}

Assistant:

static SQInteger array_replace(HSQUIRRELVM v)
{
    SQ_CHECK_IMMUTABLE_SELF;

    SQArray *dst = _array(stack_get(v, 1));
    SQArray *src = _array(stack_get(v, 2));
    dst->_values.copy(src->_values);
    dst->ShrinkIfNeeded();
    VT_CLONE_FROM_TO(src, dst);
    v->Pop(1);
    return 1;
}